

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbitmap.c
# Opt level: O0

FT_Error FT_Bitmap_Done(FT_Library library,FT_Bitmap *bitmap)

{
  FT_Memory memory;
  FT_Bitmap *bitmap_local;
  FT_Library library_local;
  
  if (library == (FT_Library)0x0) {
    library_local._4_4_ = 0x21;
  }
  else if (bitmap == (FT_Bitmap *)0x0) {
    library_local._4_4_ = 6;
  }
  else {
    ft_mem_free(library->memory,bitmap->buffer);
    bitmap->buffer = (uchar *)0x0;
    memcpy(bitmap,&null_bitmap,0x28);
    library_local._4_4_ = 0;
  }
  return library_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Bitmap_Done( FT_Library  library,
                  FT_Bitmap  *bitmap )
  {
    FT_Memory  memory;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !bitmap )
      return FT_THROW( Invalid_Argument );

    memory = library->memory;

    FT_FREE( bitmap->buffer );
    *bitmap = null_bitmap;

    return FT_Err_Ok;
  }